

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iptables_ext.c
# Opt level: O3

int match_udp(void *data,packet_t *pkt)

{
  ushort uVar1;
  ushort uVar2;
  udp_t *puVar3;
  bool bVar4;
  uint uVar5;
  byte bVar6;
  match_udp_t *m;
  ushort uVar7;
  
  uVar5 = 0;
  if ((pkt->ip_proto == '\x11') && (puVar3 = pkt->udp, puVar3 != (udp_t *)0x0)) {
    uVar1 = *data;
    bVar6 = 1;
    if (uVar1 != 0) {
      uVar7 = puVar3->src << 8 | puVar3->src >> 8;
      uVar2 = *(ushort *)((long)data + 2);
      bVar6 = 0;
      if ((uVar1 == uVar7 || uVar2 != 0) &&
         ((uVar2 == 0 || (bVar6 = 0, uVar7 <= uVar2 && uVar1 <= uVar7)))) {
        bVar6 = 1;
      }
    }
    if (bVar6 != (*(byte *)((long)data + 8) & 1)) {
      uVar1 = *(ushort *)((long)data + 4);
      bVar4 = true;
      if (uVar1 != 0) {
        uVar7 = puVar3->dst << 8 | puVar3->dst >> 8;
        uVar2 = *(ushort *)((long)data + 6);
        bVar4 = false;
        if ((uVar1 == uVar7 || uVar2 != 0) &&
           ((uVar2 == 0 || (bVar4 = false, uVar7 <= uVar2 && uVar1 <= uVar7)))) {
          bVar4 = true;
        }
      }
      uVar5 = (uint)(bVar4 != ((*(byte *)((long)data + 8) >> 1 & 1) != 0));
    }
  }
  return uVar5;
}

Assistant:

static int match_udp(void *data, packet_t *pkt)
{
	match_udp_t *m = (match_udp_t *)data;

	if (pkt->ip_proto != IPPROTO_UDP || pkt->udp == NULL) {
		return 0;
	}

	if (INVF(m, INV_UDP_SRC, !match_port(ntohs(pkt->udp->src), m->src))) {
		return 0;
	}

	if (INVF(m, INV_UDP_DST, !match_port(ntohs(pkt->udp->dst), m->dst))) {
		return 0;
	}

	return 1;
}